

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::PrintTo<phmap::priv::NonStandardLayout,int>
               (pair<phmap::priv::NonStandardLayout,_int> *value,ostream *os)

{
  std::operator<<(os,'(');
  RawBytesPrinter::PrintValue<phmap::priv::NonStandardLayout,40ul>(&value->first,os);
  std::operator<<(os,", ");
  ((void)((*{parm#2})<<{parm#1}))testing::internal::
  internal_stream_operator_without_lexical_name_lookup::StreamPrinter::PrintValue<int,void>
            (&value->second,os);
  std::operator<<(os,')');
  return;
}

Assistant:

void PrintTo(const ::std::pair<T1, T2>& value, ::std::ostream* os) {
  *os << '(';
  // We cannot use UniversalPrint(value.first, os) here, as T1 may be
  // a reference type.  The same for printing value.second.
  UniversalPrinter<T1>::Print(value.first, os);
  *os << ", ";
  UniversalPrinter<T2>::Print(value.second, os);
  *os << ')';
}